

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflateParams(z_streamp strm,int level,int strategy)

{
  deflate_state *s_00;
  int iVar1;
  int err;
  compress_func func;
  deflate_state *s;
  int strategy_local;
  int level_local;
  z_streamp strm_local;
  
  iVar1 = deflateStateCheck(strm);
  if (iVar1 == 0) {
    s_00 = strm->state;
    s._4_4_ = level;
    if (level == -1) {
      s._4_4_ = 6;
    }
    if ((((s._4_4_ < 0) || (9 < s._4_4_)) || (strategy < 0)) || (4 < strategy)) {
      strm_local._4_4_ = -2;
    }
    else {
      if (((strategy != s_00->strategy) ||
          (configuration_table[s_00->level].func != configuration_table[s._4_4_].func)) &&
         (s_00->high_water != 0)) {
        iVar1 = deflate(strm,5);
        if (iVar1 == -2) {
          return -2;
        }
        if (strm->avail_out == 0) {
          return -5;
        }
      }
      if (s_00->level != s._4_4_) {
        if ((s_00->level == 0) && (s_00->matches != 0)) {
          if (s_00->matches == 1) {
            slide_hash(s_00);
          }
          else {
            s_00->head[s_00->hash_size - 1] = 0;
          }
          memset(s_00->head,0,(ulong)(s_00->hash_size - 1) << 1);
          s_00->matches = 0;
        }
        s_00->level = s._4_4_;
        s_00->max_lazy_match = (uint)configuration_table[s._4_4_].max_lazy;
        s_00->good_match = (uint)configuration_table[s._4_4_].good_length;
        s_00->nice_match = (uint)configuration_table[s._4_4_].nice_length;
        s_00->max_chain_length = (uint)configuration_table[s._4_4_].max_chain;
      }
      s_00->strategy = strategy;
      strm_local._4_4_ = 0;
    }
  }
  else {
    strm_local._4_4_ = -2;
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflateParams(strm, level, strategy)
    z_streamp strm;
    int level;
    int strategy;
{
    deflate_state *s;
    compress_func func;

    if (deflateStateCheck(strm)) return Z_STREAM_ERROR;
    s = strm->state;

#ifdef FASTEST
    if (level != 0) level = 1;
#else
    if (level == Z_DEFAULT_COMPRESSION) level = 6;
#endif
    if (level < 0 || level > 9 || strategy < 0 || strategy > Z_FIXED) {
        return Z_STREAM_ERROR;
    }
    func = configuration_table[s->level].func;

    if ((strategy != s->strategy || func != configuration_table[level].func) &&
        s->high_water) {
        /* Flush the last buffer: */
        int err = deflate(strm, Z_BLOCK);
        if (err == Z_STREAM_ERROR)
            return err;
        if (strm->avail_out == 0)
            return Z_BUF_ERROR;
    }
    if (s->level != level) {
        if (s->level == 0 && s->matches != 0) {
            if (s->matches == 1)
                slide_hash(s);
            else
                CLEAR_HASH(s);
            s->matches = 0;
        }
        s->level = level;
        s->max_lazy_match   = configuration_table[level].max_lazy;
        s->good_match       = configuration_table[level].good_length;
        s->nice_match       = configuration_table[level].nice_length;
        s->max_chain_length = configuration_table[level].max_chain;
    }
    s->strategy = strategy;
    return Z_OK;
}